

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::saveReportMipSolution(HighsMipSolverData *this,double new_upper_limit)

{
  double mipsolver_objective_value;
  FILE *file;
  HighsMipSolver *pHVar1;
  reference rVar2;
  string local_58;
  HighsObjectiveSolution record;
  
  pHVar1 = this->mipsolver;
  if ((pHVar1->submip == false) && (new_upper_limit < this->upper_limit)) {
    if ((pHVar1->callback_->user_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&pHVar1->callback_->active,4);
      pHVar1 = this->mipsolver;
      if ((*rVar2._M_p & rVar2._M_mask) != 0) {
        HighsCallback::clearHighsCallbackDataOut(pHVar1->callback_);
        pHVar1 = this->mipsolver;
        (pHVar1->callback_->data_out).mip_solution =
             (pHVar1->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        mipsolver_objective_value = pHVar1->solution_objective_;
        std::__cxx11::string::string((string *)&local_58,"Improving solution",(allocator *)&record);
        interruptFromCallbackWithData(this,4,mipsolver_objective_value,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pHVar1 = this->mipsolver;
      }
    }
    if ((pHVar1->options_mip_->super_HighsOptionsStruct).mip_improving_solution_save == true) {
      record.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      record.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      record.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      record.objective = pHVar1->solution_objective_;
      std::vector<double,_std::allocator<double>_>::operator=(&record.col_value,&pHVar1->solution_);
      std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::push_back
                (&this->mipsolver->saved_objective_and_solution_,&record);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&record.col_value.super__Vector_base<double,_std::allocator<double>_>);
      pHVar1 = this->mipsolver;
    }
    file = pHVar1->improving_solution_file_;
    if (file != (FILE *)0x0) {
      writeLpObjective(file,&(pHVar1->options_mip_->super_HighsOptionsStruct).log_options,
                       pHVar1->orig_model_,&pHVar1->solution_);
      pHVar1 = this->mipsolver;
      writePrimalSolution(file,&(pHVar1->options_mip_->super_HighsOptionsStruct).log_options,
                          pHVar1->orig_model_,&pHVar1->solution_,
                          (pHVar1->options_mip_->super_HighsOptionsStruct).
                          mip_improving_solution_report_sparse);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::saveReportMipSolution(const double new_upper_limit) {
  const bool non_improving = new_upper_limit >= upper_limit;
  if (mipsolver.submip) return;
  if (non_improving) return;

  if (mipsolver.callback_->user_callback) {
    if (mipsolver.callback_->active[kCallbackMipImprovingSolution]) {
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipImprovingSolution, mipsolver.solution_objective_,
          "Improving solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.options_mip_->mip_improving_solution_save) {
    HighsObjectiveSolution record;
    record.objective = mipsolver.solution_objective_;
    record.col_value = mipsolver.solution_;
    mipsolver.saved_objective_and_solution_.push_back(record);
  }
  FILE* file = mipsolver.improving_solution_file_;
  if (file) {
    writeLpObjective(file, mipsolver.options_mip_->log_options,
                     *(mipsolver.orig_model_), mipsolver.solution_);
    writePrimalSolution(
        file, mipsolver.options_mip_->log_options, *(mipsolver.orig_model_),
        mipsolver.solution_,
        mipsolver.options_mip_->mip_improving_solution_report_sparse);
  }
}